

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::SolveConstrainedSystemNullSpace
               (MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *qddot,VectorNd *lambda
               ,MatrixNd *Y,MatrixNd *Z,VectorNd *qddot_y,VectorNd *qddot_z,
               LinearSolver *linear_solver)

{
  double *pdVar1;
  double *pdVar2;
  LinearSolver LVar3;
  double *pdVar4;
  double dVar5;
  double *pdVar6;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pLVar7;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ActualDstType actualDst;
  assign_op<double,_double> local_149;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_148;
  VectorNd *local_118;
  VectorNd *local_110;
  SrcXprType local_108;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_f8;
  SrcXprType local_f0;
  MatrixNd *local_e0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_d8;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d0;
  
  LVar3 = *linear_solver;
  local_118 = c;
  local_f0.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)G;
  if (LVar3 == LinearSolverHouseholderQR) {
    local_f0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::householderQr((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                     *)&local_f0);
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_d0;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)gamma;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(qddot_y,(SrcXprType *)&local_148,(assign_op<double,_double> *)&local_108);
  }
  else if (LVar3 == LinearSolverColPivHouseholderQR) {
    local_f0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::colPivHouseholderQr
              (&local_d0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_f0);
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_d0;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)gamma;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(qddot_y,(SrcXprType *)&local_148,(assign_op<double,_double> *)&local_108);
    free(local_d0.m_colNormsDirect.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_d0.m_colNormsUpdated.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_d0.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
         m_data);
    free(local_d0.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
  }
  else {
    if (LVar3 != LinearSolverPartialPivLU) goto LAB_0013b061;
    local_f0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::partialPivLu((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)&local_f0);
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_d0;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)gamma;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(qddot_y,(SrcXprType *)&local_148,(assign_op<double,_double> *)&local_108);
  }
  free(local_d0.m_colsPermutation.m_indices.
       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
LAB_0013b061:
  local_f0.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Z;
  local_e0 = Z;
  local_110 = lambda;
  local_f8 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)G;
  local_f0.m_rhs =
       (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
        *)H;
  local_d8 = &qddot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::
  LLT<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_148,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_f0);
  local_108.m_rhs =
       (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
        *)&local_d0;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)Z;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)local_118;
  local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)Y;
  local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = (Index)qddot_y;
  local_108.m_dec = &local_148;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)H;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(qddot_z,&local_108,&local_149);
  free(local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)Y;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)qddot_y;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Z;
  local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)qddot_z;
  local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_148,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_d0,(assign_op<double,_double> *)&local_f0);
  pPVar8 = local_d8;
  pdVar6 = local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  lVar11 = local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
  if ((local_d8->m_storage).m_rows !=
      local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (local_d8,local_148.m_matrix.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows,1);
    lVar11 = (pPVar8->m_storage).m_rows;
  }
  pLVar7 = local_f8;
  pdVar4 = (pPVar8->m_storage).m_data;
  uVar9 = lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar11) {
    lVar10 = 0;
    do {
      pdVar1 = pdVar6 + lVar10;
      dVar5 = pdVar1[1];
      pdVar2 = pdVar4 + lVar10;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar5;
      lVar10 = lVar10 + 2;
    } while (lVar10 < (long)uVar9);
  }
  if ((long)uVar9 < lVar11) {
    do {
      pdVar4[uVar9] = pdVar6[uVar9];
      uVar9 = uVar9 + 1;
    } while (lVar11 != uVar9);
  }
  free(local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  LVar3 = *linear_solver;
  if (LVar3 == LinearSolverPartialPivLU) {
    local_108.m_dec = pLVar7;
    local_108.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::partialPivLu((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)&local_108);
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)Y;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = (Index)pPVar8;
    local_148.m_l1_norm = (RealScalar)local_118;
    local_f0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)&local_148;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)H;
    local_f0.m_dec = &local_d0;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_110,(SrcXprType *)&local_f0,&local_149);
  }
  else if (LVar3 == LinearSolverColPivHouseholderQR) {
    local_108.m_dec = pLVar7;
    local_108.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::colPivHouseholderQr
              (&local_d0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_108);
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)Y;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = (Index)pPVar8;
    local_148.m_l1_norm = (RealScalar)local_118;
    local_f0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)&local_148;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)H;
    local_f0.m_dec = &local_d0;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_110,&local_f0,&local_149);
    free(local_d0.m_colNormsDirect.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_d0.m_colNormsUpdated.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_d0.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
         m_data);
    free(local_d0.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
  }
  else {
    if (LVar3 != LinearSolverHouseholderQR) {
      return;
    }
    local_108.m_dec = pLVar7;
    local_108.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::householderQr((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                     *)&local_108);
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)Y;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = (Index)pPVar8;
    local_148.m_l1_norm = (RealScalar)local_118;
    local_f0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)&local_148;
    local_148.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)H;
    local_f0.m_dec = &local_d0;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_110,(SrcXprType *)&local_f0,&local_149);
  }
  free(local_d0.m_colsPermutation.m_indices.
       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

RBDL_DLLAPI
void SolveConstrainedSystemNullSpace (
  Math::MatrixNd &H,
  const Math::MatrixNd &G,
  const Math::VectorNd &c,
  const Math::VectorNd &gamma,
  Math::VectorNd &qddot,
  Math::VectorNd &lambda,
  Math::MatrixNd &Y,
  Math::MatrixNd &Z,
  Math::VectorNd &qddot_y,
  Math::VectorNd &qddot_z,
  Math::LinearSolver &linear_solver
)
{

#ifdef RBDL_USE_CASADI_MATH
    auto GY = G * Y;
    auto linsol = casadi::Linsol("linear_solver", "symbolicqr", GY.sparsity());
    qddot_y = linsol.solve(GY, gamma);
#else
  switch (linear_solver) {
  case (LinearSolverPartialPivLU) :
    qddot_y = (G * Y).partialPivLu().solve (gamma);
    break;
  case (LinearSolverColPivHouseholderQR) :
    qddot_y = (G * Y).colPivHouseholderQr().solve (gamma);
    break;
  case (LinearSolverHouseholderQR) :
    qddot_y = (G * Y).householderQr().solve (gamma);
    break;
  default:
    LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
    assert (0);
    break;
  }
#endif

#ifdef RBDL_USE_CASADI_MATH
    auto ZHZ = (Z.transpose()*H*Z);
    linsol = casadi::Linsol("linear_solver", "symbolicqr", ZHZ.sparsity());
    qddot_z = linsol.solve(ZHZ, Z.transpose()*(c - H*Y*qddot_y));
#else
  qddot_z = (Z.transpose()*H*Z).llt().solve(Z.transpose()*(c - H*Y*qddot_y));
#endif
  qddot = Y * qddot_y + Z * qddot_z;

#ifdef RBDL_USE_CASADI_MATH
    GY = G * Y;
    linsol = casadi::Linsol("linear_solver", "symbolicqr", GY.sparsity());
    lambda = linsol.solve(GY, Y.transpose() * (H * qddot - c));
#else
  switch (linear_solver) {
  case (LinearSolverPartialPivLU) :
    lambda = (G * Y).partialPivLu().solve (Y.transpose() * (H * qddot - c));
    break;
  case (LinearSolverColPivHouseholderQR) :
    lambda = (G*Y).colPivHouseholderQr().solve (Y.transpose()*(H*qddot - c));
    break;
  case (LinearSolverHouseholderQR) :
    lambda = (G * Y).householderQr().solve (Y.transpose() * (H * qddot - c));
    break;
  default:
    LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
    assert (0);
    break;
  }
#endif
}